

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

bool QtPrivate::sequential_erase_one<QList<QTabBar*>,QMainWindowTabBar*>
               (QList<QTabBar_*> *c,QMainWindowTabBar **t)

{
  const_iterator __first;
  const_iterator pos;
  bool bVar1;
  const_iterator this;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  const_iterator cend;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QTabBar **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QTabBar_*>::cend
                       ((QList<QTabBar_*> *)
                        CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  local_18.i = (QTabBar **)&DAT_aaaaaaaaaaaaaaaa;
  this = QList<QTabBar_*>::cbegin
                   ((QList<QTabBar_*> *)
                    CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  __first.i._7_1_ = in_stack_ffffffffffffffcf;
  __first.i._0_7_ = in_stack_ffffffffffffffc8;
  local_18 = std::find<QList<QTabBar*>::const_iterator,QMainWindowTabBar*>
                       (__first,in_RDI,
                        (QMainWindowTabBar **)
                        CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar1 = QList<QTabBar_*>::const_iterator::operator==(&local_18,local_10);
  if (!bVar1) {
    pos.i._7_1_ = in_stack_ffffffffffffffcf;
    pos.i._0_7_ = in_stack_ffffffffffffffc8;
    QList<QTabBar_*>::erase((QList<QTabBar_*> *)this.i,pos);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return !bVar1;
}

Assistant:

auto sequential_erase_one(Container &c, const T &t)
{
    const auto cend = c.cend();
    const auto it = std::find(c.cbegin(), cend, t);
    if (it == cend)
        return false;
    c.erase(it);
    return true;
}